

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::~WindowImplX11(WindowImplX11 *this)

{
  __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
  __position;
  EVP_PKEY_CTX *in_RSI;
  Lock lock;
  Lock LStack_18;
  WindowImplX11 *local_10;
  
  (this->super_WindowImpl)._vptr_WindowImpl = (_func_int **)&PTR__WindowImplX11_0027bbe0;
  cleanup(this,in_RSI);
  if (this->m_iconPixmap != 0) {
    XFreePixmap(this->m_display);
  }
  if (this->m_iconMaskPixmap != 0) {
    XFreePixmap(this->m_display);
  }
  if (this->m_hiddenCursor != 0) {
    XFreeCursor(this->m_display);
  }
  if (this->m_inputContext != (XIC)0x0) {
    XDestroyIC();
  }
  if ((this->m_window != 0) && (this->m_isExternal == false)) {
    XDestroyWindow(this->m_display);
    XFlush(this->m_display);
  }
  if (this->m_inputMethod != (XIM)0x0) {
    CloseXIM(this->m_inputMethod);
  }
  CloseDisplay(this->m_display);
  Lock::Lock(&LStack_18,(Mutex *)&(anonymous_namespace)::WindowsImplX11Impl::allWindowsMutex);
  local_10 = this;
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<sf::priv::WindowImplX11**,std::vector<sf::priv::WindowImplX11*,std::allocator<sf::priv::WindowImplX11*>>>,__gnu_cxx::__ops::_Iter_equals_val<sf::priv::WindowImplX11*const>>
                         ((anonymous_namespace)::WindowsImplX11Impl::allWindows,DAT_00282ad8);
  std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::erase
            ((vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_> *)
             &(anonymous_namespace)::WindowsImplX11Impl::allWindows,
             (const_iterator)__position._M_current);
  Lock::~Lock(&LStack_18);
  WindowImpl::~WindowImpl(&this->super_WindowImpl);
  return;
}

Assistant:

WindowImplX11::~WindowImplX11()
{
    using namespace WindowsImplX11Impl;

    // Cleanup graphical resources
    cleanup();

    // Destroy icon pixmap
    if (m_iconPixmap)
        XFreePixmap(m_display, m_iconPixmap);

    // Destroy icon mask pixmap
    if (m_iconMaskPixmap)
        XFreePixmap(m_display, m_iconMaskPixmap);

    // Destroy the cursor
    if (m_hiddenCursor)
        XFreeCursor(m_display, m_hiddenCursor);

    // Destroy the input context
    if (m_inputContext)
        XDestroyIC(m_inputContext);

    // Destroy the window
    if (m_window && !m_isExternal)
    {
        XDestroyWindow(m_display, m_window);
        XFlush(m_display);
    }

    // Close the input method
    if (m_inputMethod)
        CloseXIM(m_inputMethod);

    // Close the connection with the X server
    CloseDisplay(m_display);

    // Remove this window from the global list of windows (required for focus request)
    Lock lock(allWindowsMutex);
    allWindows.erase(std::find(allWindows.begin(), allWindows.end(), this));
}